

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

int lj_cf_package_require(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_State *L_00;
  int *piVar3;
  char *pcVar4;
  lua_State *in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  undefined4 in_stack_00000008;
  int in_stack_0000000c;
  lua_State *in_stack_00000010;
  int i;
  char *name;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  lua_State *in_stack_ffffffffffffffd0;
  lua_State *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  lua_State *in_stack_ffffffffffffffe8;
  lua_State *plVar5;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  L_00 = (lua_State *)
         luaL_checklstring(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                           (size_t *)in_stack_ffffffffffffffd8);
  lua_settop(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  lua_getfield(in_stack_00000010,in_stack_0000000c,(char *)CONCAT44(unaff_retaddr_00,unaff_retaddr))
  ;
  lua_getfield(in_stack_00000010,in_stack_0000000c,(char *)CONCAT44(unaff_retaddr_00,unaff_retaddr))
  ;
  iVar1 = lua_toboolean(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  if (iVar1 == 0) {
    lua_getfield(in_stack_00000010,in_stack_0000000c,
                 (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    iVar1 = lua_type(in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    if (iVar1 != 5) {
      luaL_error(in_RDI,"\'package.loaders\' must be a table");
    }
    lua_pushlstring(L_00,(char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    (size_t)in_stack_ffffffffffffffd8);
    iVar1 = 1;
    while( true ) {
      lua_rawgeti(L_00,iVar1,in_stack_ffffffffffffffe0);
      iVar2 = lua_type(in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
      if (iVar2 == 0) {
        in_stack_ffffffffffffffd0 = in_RDI;
        plVar5 = L_00;
        pcVar4 = lua_tolstring((lua_State *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                               (int)((ulong)L_00 >> 0x20),(size_t *)in_RDI);
        luaL_error(in_stack_ffffffffffffffd0,"module \'%s\' not found:%s",L_00,pcVar4);
        in_stack_ffffffffffffffd8 = L_00;
        L_00 = plVar5;
      }
      lua_pushstring(L_00,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
      lua_call(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      iVar2 = lua_type(in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
      if (iVar2 == 6) break;
      iVar2 = lua_isstring((lua_State *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                           (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
      if (iVar2 == 0) {
        lua_settop(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      }
      else {
        lua_concat((lua_State *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                   (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
      }
      iVar1 = iVar1 + 1;
    }
    lua_pushlightuserdata
              ((lua_State *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    lua_setfield((lua_State *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,
                 (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    lua_pushstring(L_00,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    lua_call(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    iVar1 = lua_type(in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    if (iVar1 != 0) {
      lua_setfield((lua_State *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,
                   (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    }
    lua_getfield(in_stack_00000010,in_stack_0000000c,
                 (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    piVar3 = (int *)lua_touserdata(in_stack_ffffffffffffffd8,
                                   (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    if (piVar3 == &sentinel_) {
      lua_pushboolean(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      lua_pushvalue(in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
      lua_setfield((lua_State *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,
                   (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    }
  }
  else {
    piVar3 = (int *)lua_touserdata(in_stack_ffffffffffffffd8,
                                   (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    if (piVar3 == &sentinel_) {
      luaL_error(in_RDI,"loop or previous error loading module \'%s\'",L_00);
    }
  }
  return 1;
}

Assistant:

static int lj_cf_package_require(lua_State *L)
{
  const char *name = luaL_checkstring(L, 1);
  int i;
  lua_settop(L, 1);  /* _LOADED table will be at index 2 */
  lua_getfield(L, LUA_REGISTRYINDEX, "_LOADED");
  lua_getfield(L, 2, name);
  if (lua_toboolean(L, -1)) {  /* is it there? */
    if (lua_touserdata(L, -1) == sentinel)  /* check loops */
      luaL_error(L, "loop or previous error loading module " LUA_QS, name);
    return 1;  /* package is already loaded */
  }
  /* else must load it; iterate over available loaders */
  lua_getfield(L, LUA_ENVIRONINDEX, "loaders");
  if (!lua_istable(L, -1))
    luaL_error(L, LUA_QL("package.loaders") " must be a table");
  lua_pushliteral(L, "");  /* error message accumulator */
  for (i = 1; ; i++) {
    lua_rawgeti(L, -2, i);  /* get a loader */
    if (lua_isnil(L, -1))
      luaL_error(L, "module " LUA_QS " not found:%s",
		 name, lua_tostring(L, -2));
    lua_pushstring(L, name);
    lua_call(L, 1, 1);  /* call it */
    if (lua_isfunction(L, -1))  /* did it find module? */
      break;  /* module loaded successfully */
    else if (lua_isstring(L, -1))  /* loader returned error message? */
      lua_concat(L, 2);  /* accumulate it */
    else
      lua_pop(L, 1);
  }
  lua_pushlightuserdata(L, sentinel);
  lua_setfield(L, 2, name);  /* _LOADED[name] = sentinel */
  lua_pushstring(L, name);  /* pass name as argument to module */
  lua_call(L, 1, 1);  /* run loaded module */
  if (!lua_isnil(L, -1))  /* non-nil return? */
    lua_setfield(L, 2, name);  /* _LOADED[name] = returned value */
  lua_getfield(L, 2, name);
  if (lua_touserdata(L, -1) == sentinel) {   /* module did not set a value? */
    lua_pushboolean(L, 1);  /* use true as result */
    lua_pushvalue(L, -1);  /* extra copy to be returned */
    lua_setfield(L, 2, name);  /* _LOADED[name] = true */
  }
  lj_lib_checkfpu(L);
  return 1;
}